

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

int pbrt::RandomWalk(Integrator *integrator,SampledWavelengths *lambda,RayDifferential *ray,
                    Sampler *sampler,Camera *camera,ScratchBuffer *scratchBuffer,
                    SampledSpectrum beta,Float pdf,int maxDepth,TransportMode mode,Vertex *path,
                    bool regularize)

{
  undefined1 auVar1 [64];
  Normal3<float> n;
  Point3<float> args;
  Vector3<float> args_00;
  Vector3<float> v;
  anon_class_88_11_2c01bdca callback;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Vector3f wiRender;
  Vector3f wiRender_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Vector3f woRender;
  Vector3f woRender_00;
  undefined1 auVar6 [16];
  Vector3f woRender_01;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  int iVar12;
  ShapeIntersection *pSVar13;
  BSDFSample *pBVar14;
  Vertex *this;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  Float FVar17;
  type pdf_00;
  Float FVar18;
  Point2f u2;
  undefined8 uVar19;
  undefined8 extraout_XMM0_Qb;
  BSDF *this_00;
  undefined1 in_ZMM0 [64];
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 in_ZMM1 [64];
  Float in_XMM2_Da;
  SampledSpectrum SVar22;
  int in_stack_00000008;
  TransportMode in_stack_00000010;
  long in_stack_00000018;
  byte in_stack_00000020;
  Float pdfRev;
  optional<pbrt::BSDFSample> bs;
  Float u;
  Vector3f wo;
  Float in_stack_000004d0;
  int in_stack_000004d4;
  BSDF *in_stack_000004d8;
  RayDifferential *in_stack_000004e0;
  SurfaceInteraction *in_stack_000004e8;
  Tuple3<pbrt::Vector3,_float> in_stack_00000500;
  BSDF bsdf;
  SurfaceInteraction *isect;
  SampledSpectrum T_maj;
  Float u_1;
  RNG rng;
  Float tMax;
  optional<pbrt::ShapeIntersection> si;
  Vertex *prev;
  Vertex *vertex;
  bool terminated;
  bool scattered;
  Float pdfFwd;
  bool anyNonSpecularBounces;
  int bounces;
  undefined4 in_stack_fffffffffffff618;
  int in_stack_fffffffffffff61c;
  Vertex *v_00;
  undefined4 in_stack_fffffffffffff620;
  Float in_stack_fffffffffffff624;
  undefined4 in_stack_fffffffffffff628;
  Float in_stack_fffffffffffff62c;
  undefined4 in_stack_fffffffffffff630;
  Float in_stack_fffffffffffff634;
  EndpointInteraction *in_stack_fffffffffffff638;
  BSDF *in_stack_fffffffffffff640;
  SurfaceInteraction *in_stack_fffffffffffff648;
  float in_stack_fffffffffffff654;
  float in_stack_fffffffffffff65c;
  Ray *in_stack_fffffffffffff660;
  undefined8 in_stack_fffffffffffff668;
  float in_stack_fffffffffffff670;
  undefined8 in_stack_fffffffffffff678;
  float in_stack_fffffffffffff680;
  undefined4 in_stack_fffffffffffff684;
  undefined8 in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff690;
  undefined4 in_stack_fffffffffffff694;
  undefined8 in_stack_fffffffffffff698;
  undefined4 in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a4;
  Ray *in_stack_fffffffffffff6a8;
  EndpointInteraction *in_stack_fffffffffffff6b0;
  undefined8 in_stack_fffffffffffff6b8;
  undefined8 in_stack_fffffffffffff6c0;
  undefined8 in_stack_fffffffffffff6c8;
  bool *in_stack_fffffffffffff6d0;
  BxDFReflTransFlags in_stack_fffffffffffff6d8;
  float sampleFlags;
  TransportMode in_stack_fffffffffffff6dc;
  float mode_00;
  BSDF *in_stack_fffffffffffff6e0;
  undefined8 in_stack_fffffffffffff6f8;
  float in_stack_fffffffffffff700;
  float fVar23;
  undefined4 uStack_8fc;
  Vertex *in_stack_fffffffffffff718;
  float in_stack_fffffffffffff720;
  Float local_8a8;
  undefined8 in_stack_fffffffffffff760;
  BxDFReflTransFlags sampleFlags_00;
  undefined8 in_stack_fffffffffffff768;
  undefined4 in_stack_fffffffffffff770;
  undefined4 uStack_880;
  Float in_stack_fffffffffffff784;
  RayDifferential *in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  float in_stack_fffffffffffff798;
  Float local_7bc;
  optional local_60c [48];
  Float local_5dc;
  undefined8 local_5d8;
  float local_5d0;
  ScratchBuffer *in_stack_fffffffffffffb48;
  Camera *in_stack_fffffffffffffb50;
  SampledWavelengths *in_stack_fffffffffffffb58;
  RayDifferential *in_stack_fffffffffffffb60;
  SurfaceInteraction *in_stack_fffffffffffffb68;
  Sampler *in_stack_fffffffffffffb80;
  Vertex local_478;
  uint local_284;
  undefined8 local_280;
  undefined8 local_278;
  byte *pbStack_268;
  undefined8 *puStack_260;
  long lStack_250;
  Float *pFStack_248;
  long lStack_240;
  int *piStack_238;
  undefined4 *local_230;
  byte *local_228;
  byte *local_220;
  undefined8 local_1ec;
  undefined8 local_1e4;
  Float local_1dc;
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined8 local_1a8;
  undefined4 local_1a0;
  Float local_188;
  optional local_178 [264];
  long local_70;
  long local_68;
  byte local_5e;
  byte local_5d;
  Float local_5c;
  byte local_55;
  int local_54;
  byte local_4d;
  undefined8 local_14;
  undefined8 local_c;
  int local_4;
  
  sampleFlags_00 = (BxDFReflTransFlags)((ulong)in_stack_fffffffffffff760 >> 0x20);
  local_14 = vmovlpd_avx(in_ZMM0._0_16_);
  local_c = vmovlpd_avx(in_ZMM1._0_16_);
  local_4d = in_stack_00000020 & 1;
  if (in_stack_00000008 == 0) {
    local_4 = 0;
  }
  else {
    local_54 = 0;
    local_55 = 0;
    local_5c = in_XMM2_Da;
    bVar11 = SampledSpectrum::operator_cast_to_bool
                       ((SampledSpectrum *)
                        CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
    if (bVar11) {
      local_5d = 0;
      local_5e = 0;
      local_68 = in_stack_00000018 + (long)local_54 * 0x150;
      local_70 = in_stack_00000018 + (long)(local_54 + -1) * 0x150;
      Integrator::Intersect
                ((Integrator *)in_stack_fffffffffffff638,
                 (Ray *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                 in_stack_fffffffffffff62c);
      bVar11 = TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RDX + 4));
      if (bVar11) {
        bVar11 = pstd::optional::operator_cast_to_bool(local_178);
        if (bVar11) {
          pSVar13 = pstd::optional<pbrt::ShapeIntersection>::operator->
                              ((optional<pbrt::ShapeIntersection> *)0x6291fe);
          local_7bc = pSVar13->tHit;
        }
        else {
          local_7bc = INFINITY;
        }
        local_188 = local_7bc;
        local_1b0 = *(undefined4 *)(in_RDX + 1);
        local_1b8 = *in_RDX;
        args.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff670;
        args.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffff668;
        args.super_Tuple3<pbrt::Point3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff668 >> 0x20);
        local_1a8 = local_1b8;
        local_1a0 = local_1b0;
        Hash<pbrt::Point3<float>,float>(args,in_stack_fffffffffffff654);
        local_1d0 = *(undefined4 *)((long)in_RDX + 0x14);
        local_1d8 = *(undefined8 *)((long)in_RDX + 0xc);
        args_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff670;
        args_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff668;
        args_00.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffff668 >> 0x20);
        local_1c8 = local_1d8;
        local_1c0 = local_1d0;
        Hash<pbrt::Vector3<float>>(args_00);
        RNG::RNG((RNG *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                 CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618),0x629327);
        local_1dc = Sampler::Get1D((Sampler *)
                                   CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
        Ray::Ray((Ray *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                 (Ray *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
        pbStack_268 = &local_5e;
        puStack_260 = &local_14;
        lStack_250 = local_68;
        pFStack_248 = &local_5c;
        lStack_240 = local_70;
        piStack_238 = &local_54;
        local_230 = &stack0x00000008;
        local_228 = &local_55;
        local_220 = &local_5d;
        auVar16._8_8_ = pbStack_268;
        auVar16._0_8_ = in_RCX;
        auVar16._16_8_ = puStack_260;
        auVar16._24_8_ = in_RDX;
        auVar16._32_8_ = local_68;
        auVar16._40_8_ = pFStack_248;
        auVar16._48_8_ = local_70;
        auVar16._56_8_ = piStack_238;
        auVar15 = vmovdqu64_avx512f(auVar16);
        auVar1._8_8_ = local_68;
        auVar1._0_8_ = in_RDX;
        auVar1._16_8_ = pFStack_248;
        auVar1._24_8_ = local_70;
        auVar1._32_8_ = piStack_238;
        auVar1._40_8_ = local_230;
        auVar1._48_8_ = local_228;
        auVar1._56_8_ = local_220;
        auVar16 = vmovdqu64_avx512f(auVar1);
        auVar16 = vmovdqu64_avx512f(auVar16);
        in_stack_fffffffffffff65c = auVar16._44_4_;
        in_stack_fffffffffffff660 = auVar16._48_8_;
        auVar1 = vmovdqu64_avx512f(auVar15);
        in_stack_fffffffffffff618 = auVar1._0_4_;
        in_stack_fffffffffffff61c = auVar1._4_4_;
        in_stack_fffffffffffff620 = auVar1._8_4_;
        in_stack_fffffffffffff624 = auVar1._12_4_;
        in_stack_fffffffffffff628 = auVar1._16_4_;
        in_stack_fffffffffffff62c = auVar1._20_4_;
        in_stack_fffffffffffff630 = auVar1._24_4_;
        in_stack_fffffffffffff634 = auVar1._28_4_;
        in_stack_fffffffffffff638 = auVar1._32_8_;
        in_stack_fffffffffffff640 = auVar1._40_8_;
        in_stack_fffffffffffff648 = auVar1._48_8_;
        uVar19 = 0;
        uVar20 = 0;
        callback.sampler._4_4_ = in_stack_fffffffffffff684;
        callback.sampler._0_4_ = in_stack_fffffffffffff680;
        callback.terminated = (bool *)in_stack_fffffffffffff688;
        callback.beta._0_4_ = in_stack_fffffffffffff690;
        callback.beta._4_4_ = in_stack_fffffffffffff694;
        callback.ray = (RayDifferential *)in_stack_fffffffffffff698;
        callback.vertex._0_4_ = in_stack_fffffffffffff6a0;
        callback.vertex._4_4_ = in_stack_fffffffffffff6a4;
        callback.pdfFwd = (Float *)in_stack_fffffffffffff6a8;
        callback.prev = (Vertex *)in_stack_fffffffffffff6b0;
        callback.bounces = (int *)in_stack_fffffffffffff6b8;
        callback.maxDepth = (int *)in_stack_fffffffffffff6c0;
        callback.anyNonSpecularBounces = (bool *)in_stack_fffffffffffff6c8;
        callback.scattered = in_stack_fffffffffffff6d0;
        SVar22 = SampleT_maj<pbrt::RandomWalk(pbrt::Integrator_const&,pbrt::SampledWavelengths&,pbrt::RayDifferential,pbrt::Sampler,pbrt::Camera,pbrt::ScratchBuffer&,pbrt::SampledSpectrum,float,int,pbrt::TransportMode,pbrt::Vertex*,bool)::__0>
                           (in_stack_fffffffffffff660,in_stack_fffffffffffff65c,auVar16._40_4_,
                            auVar1._56_8_,(SampledWavelengths *)in_stack_fffffffffffff648,callback);
        auVar9._8_8_ = uVar20;
        auVar9._0_8_ = SVar22.values.values._8_8_;
        auVar10._8_8_ = uVar19;
        auVar10._0_8_ = SVar22.values.values._0_8_;
        local_1ec = vmovlpd_avx(auVar10);
        local_1e4 = vmovlpd_avx(auVar9);
        if ((local_5d & 1) == 0) {
          SampledSpectrum::operator[]
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                     in_stack_fffffffffffff61c);
          uVar20 = 0;
          SVar22 = SampledSpectrum::operator/
                             ((SampledSpectrum *)
                              CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628),
                              in_stack_fffffffffffff624);
          auVar7._8_8_ = uVar19;
          auVar7._0_8_ = SVar22.values.values._8_8_;
          auVar8._8_8_ = uVar20;
          auVar8._0_8_ = SVar22.values.values._0_8_;
          local_280 = vmovlpd_avx(auVar8);
          local_278 = vmovlpd_avx(auVar7);
          SampledSpectrum::operator*=
                    ((SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                     (SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
        }
      }
      if ((local_5e & 1) == 0) {
        if ((local_5d & 1) == 0) {
          bVar11 = pstd::optional::operator_cast_to_bool(local_178);
          if (bVar11) {
            local_478.field_2._40_8_ =
                 pstd::optional<pbrt::ShapeIntersection>::operator->
                           ((optional<pbrt::ShapeIntersection> *)0x629650);
            Camera::Camera((Camera *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                           (Camera *)CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
            Sampler::Sampler((Sampler *)
                             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                             (Sampler *)
                             CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
            v_00 = &local_478;
            SurfaceInteraction::GetBSDF
                      (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58
                       ,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                       in_stack_fffffffffffffb80);
            bVar11 = BSDF::operator_cast_to_bool((BSDF *)0x62971a);
            if (bVar11) {
              if (((local_4d & 1) != 0) && ((local_55 & 1) != 0)) {
                *(long *)(in_FS_OFFSET + -0x3f0) = *(long *)(in_FS_OFFSET + -0x3f0) + 1;
                BSDF::Regularize((BSDF *)0x6297c4);
              }
              *(long *)(in_FS_OFFSET + -1000) = *(long *)(in_FS_OFFSET + -1000) + 1;
              Vertex::CreateSurface
                        (in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                         (SampledSpectrum *)in_stack_fffffffffffff638,in_stack_fffffffffffff634,
                         (Vertex *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
              Vertex::operator=((Vertex *)
                                CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),v_00);
              local_54 = local_54 + 1;
              if (local_54 < in_stack_00000008) {
                local_5d0 = *(float *)(local_478.field_2._40_8_ + 0x24);
                local_5d8._0_4_ =
                     (((Vector3f *)(local_478.field_2._40_8_ + 0x1c))->
                     super_Tuple3<pbrt::Vector3,_float>).x;
                local_5d8._4_4_ =
                     (((Vector3f *)(local_478.field_2._40_8_ + 0x1c))->
                     super_Tuple3<pbrt::Vector3,_float>).y;
                FVar17 = Sampler::Get1D((Sampler *)
                                        CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620
                                                ));
                FVar18 = FVar17;
                local_5dc = FVar17;
                u2 = Sampler::Get2D((Sampler *)v_00);
                uStack_880 = (undefined4)extraout_XMM0_Qb;
                auVar6._8_4_ = uStack_880;
                auVar6._0_4_ = u2.super_Tuple2<pbrt::Point2,_float>.x;
                auVar6._4_4_ = u2.super_Tuple2<pbrt::Point2,_float>.y;
                auVar6._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
                vmovlpd_avx(auVar6);
                woRender_01.super_Tuple3<pbrt::Vector3,_float>.y = FVar18;
                woRender_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff790;
                woRender_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff798;
                BSDF::Sample_f((BSDF *)CONCAT44(FVar17,in_stack_fffffffffffff770),woRender_01,
                               (Float)((ulong)in_stack_fffffffffffff768 >> 0x20),u2,
                               (TransportMode)in_stack_fffffffffffff768,sampleFlags_00);
                bVar11 = pstd::optional::operator_cast_to_bool(local_60c);
                if (bVar11) {
                  pBVar14 = pstd::optional<pbrt::BSDFSample>::operator->
                                      ((optional<pbrt::BSDFSample> *)0x6299c3);
                  if ((pBVar14->pdfIsProportional & 1U) == 0) {
                    pBVar14 = pstd::optional<pbrt::BSDFSample>::operator->
                                        ((optional<pbrt::BSDFSample> *)0x629ad7);
                    local_8a8 = pBVar14->pdf;
                  }
                  else {
                    pstd::optional<pbrt::BSDFSample>::operator->
                              ((optional<pbrt::BSDFSample> *)0x629a0a);
                    woRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff720;
                    woRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff718;
                    wiRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff700;
                    wiRender.super_Tuple3<pbrt::Vector3,_float>.x =
                         (float)(int)in_stack_fffffffffffff6f8;
                    wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
                         (float)(int)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
                    local_8a8 = BSDF::PDF(in_stack_fffffffffffff6e0,woRender,wiRender,
                                          in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8);
                  }
                  local_5c = local_8a8;
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x629b16);
                  bVar11 = BSDFSample::IsSpecular((BSDFSample *)0x629b2d);
                  local_55 = (local_55 | ~bVar11) & 1;
                  this = (Vertex *)
                         pstd::optional<pbrt::BSDFSample>::operator->
                                   ((optional<pbrt::BSDFSample> *)0x629b5e);
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x629b85);
                  uVar21 = 0;
                  v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff680;
                  v.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffff678;
                  v.super_Tuple3<pbrt::Vector3,_float>.y =
                       (float)(int)((ulong)in_stack_fffffffffffff678 >> 0x20);
                  n.super_Tuple3<pbrt::Normal3,_float>._4_8_ = in_stack_fffffffffffff660;
                  n.super_Tuple3<pbrt::Normal3,_float>.x = in_stack_fffffffffffff65c;
                  pdf_00 = AbsDot<float>(v,n);
                  uVar19 = 0;
                  SVar22 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                      in_stack_fffffffffffff62c);
                  uVar20 = SVar22.values.values._8_8_;
                  fVar23 = (float)uVar21;
                  uStack_8fc = (undefined4)((ulong)uVar21 >> 0x20);
                  auVar4._8_4_ = fVar23;
                  auVar4._0_8_ = uVar20;
                  auVar4._12_4_ = uStack_8fc;
                  auVar5._8_8_ = uVar19;
                  auVar5._0_8_ = SVar22.values.values._0_8_;
                  vmovlpd_avx(auVar5);
                  vmovlpd_avx(auVar4);
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x629c9c);
                  this_00 = (BSDF *)0x0;
                  SVar22 = SampledSpectrum::operator/
                                     ((SampledSpectrum *)
                                      CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628),
                                      in_stack_fffffffffffff624);
                  sampleFlags = SVar22.values.values[0];
                  mode_00 = SVar22.values.values[1];
                  auVar2._8_8_ = uVar19;
                  auVar2._0_8_ = SVar22.values.values._8_8_;
                  auVar3._8_8_ = this_00;
                  auVar3._0_8_ = SVar22.values.values._0_8_;
                  vmovlpd_avx(auVar3);
                  vmovlpd_avx(auVar2);
                  SampledSpectrum::operator*=
                            ((SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                             (SampledSpectrum *)
                             CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x629d2c);
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x629d61);
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x629d8a);
                  SurfaceInteraction::SpawnRay
                            (in_stack_000004e8,in_stack_000004e0,in_stack_000004d8,
                             (Vector3f)in_stack_00000500,in_stack_000004d4,in_stack_000004d0);
                  RayDifferential::operator=
                            ((RayDifferential *)
                             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                             (RayDifferential *)v_00);
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x629e24);
                  operator!(in_stack_00000010);
                  woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff720;
                  woRender_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff718;
                  wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar23;
                  wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar20;
                  wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y =
                       (float)(int)((ulong)uVar20 >> 0x20);
                  BSDF::PDF(this_00,woRender_00,wiRender_00,(TransportMode)mode_00,
                            (BxDFReflTransFlags)sampleFlags);
                  pstd::optional<pbrt::BSDFSample>::operator->
                            ((optional<pbrt::BSDFSample> *)0x629f16);
                  bVar11 = BSDFSample::IsSpecular((BSDFSample *)0x629f27);
                  if (bVar11) {
                    *(undefined1 *)(local_68 + 0x140) = 1;
                    local_5c = 0.0;
                  }
                  FVar18 = Vertex::ConvertDensity(this,pdf_00,in_stack_fffffffffffff718);
                  *(Float *)(local_70 + 0x148) = FVar18;
                  local_284 = 0;
                }
                else {
                  local_284 = 3;
                }
                pstd::optional<pbrt::BSDFSample>::~optional((optional<pbrt::BSDFSample> *)0x629fb4);
              }
              else {
                local_284 = 3;
              }
            }
            else {
              pstd::optional<pbrt::ShapeIntersection>::operator->
                        ((optional<pbrt::ShapeIntersection> *)0x62974d);
              SurfaceInteraction::SkipIntersection
                        ((SurfaceInteraction *)
                         CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                         in_stack_fffffffffffff788,in_stack_fffffffffffff784);
              local_284 = 2;
            }
          }
          else {
            if (in_stack_00000010 == Radiance) {
              EndpointInteraction::EndpointInteraction
                        (in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
              Vertex::CreateLight(in_stack_fffffffffffff638,
                                  (SampledSpectrum *)
                                  CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                  in_stack_fffffffffffff62c);
              Vertex::operator=((Vertex *)
                                CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                                (Vertex *)
                                CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
              local_54 = local_54 + 1;
            }
            local_284 = 3;
          }
        }
        else {
          local_284 = 2;
        }
      }
      else {
        local_4 = local_54;
        local_284 = 1;
      }
      pstd::optional<pbrt::ShapeIntersection>::~optional
                ((optional<pbrt::ShapeIntersection> *)0x629fc1);
      iVar12 = (*(code *)(&DAT_00b9e4b0 + *(int *)(&DAT_00b9e4b0 + (ulong)local_284 * 4)))();
      return iVar12;
    }
    local_4 = local_54;
  }
  return local_4;
}

Assistant:

int RandomWalk(const Integrator &integrator, SampledWavelengths &lambda,
               RayDifferential ray, Sampler sampler, Camera camera,
               ScratchBuffer &scratchBuffer, SampledSpectrum beta, Float pdf,
               int maxDepth, TransportMode mode, Vertex *path, bool regularize) {
    if (maxDepth == 0)
        return 0;
    // Follow random walk to initialize BDPT path vertices
    int bounces = 0;
    bool anyNonSpecularBounces = false;
    Float pdfFwd = pdf;
    while (true) {
        // Attempt to create the next subpath vertex in _path_
        PBRT_DBG("%s\n", StringPrintf("Random walk. Bounces %d, beta %s, pdfFwd %f",
                                      bounces, beta, pdfFwd)
                             .c_str());
        if (!beta)
            break;
        bool scattered = false, terminated = false;
        // Trace a ray and sample the medium, if any
        Vertex &vertex = path[bounces], &prev = path[bounces - 1];
        pstd::optional<ShapeIntersection> si = integrator.Intersect(ray);
        if (ray.medium) {
            // Sample participating medium for _RandomWalk()_ ray
            Float tMax = si ? si->tHit : Infinity;
            RNG rng(Hash(ray.o, tMax), Hash(ray.d));
            Float u = sampler.Get1D();
            SampledSpectrum T_maj = SampleT_maj(
                ray, tMax, u, rng, lambda,
                [&](Point3f p, MediumProperties mp, SampledSpectrum sigma_maj,
                    SampledSpectrum T_maj) {
                    // Compute medium event probabilities for interaction
                    Float pAbsorb = mp.sigma_a[0] / sigma_maj[0];
                    Float pScatter = mp.sigma_s[0] / sigma_maj[0];
                    Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                    // Randomly sample medium event for _RandomRalk()_ ray
                    Float um = sampler.Get1D();
                    int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, um);
                    if (mode == 0) {
                        // Handle absorption for _RandomWalk()_ ray
                        terminated = true;
                        return false;

                    } else if (mode == 1) {
                        // Handle scattering for _RandomWalk()_ ray
                        beta *= T_maj * mp.sigma_s / (T_maj[0] * mp.sigma_s[0]);
                        // Record medium interaction in _path_ and compute forward density
                        MediumInteraction intr(p, -ray.d, ray.time, ray.medium, mp.phase);
                        vertex = Vertex::CreateMedium(intr, beta, pdfFwd, prev);
                        if (++bounces >= maxDepth) {
                            terminated = true;
                            return false;
                        }

                        // Sample direction and compute reverse density at preceding
                        // vertex
                        pstd::optional<PhaseFunctionSample> ps =
                            intr.phase.Sample_p(-ray.d, sampler.Get2D());
                        if (!ps || ps->pdf == 0) {
                            terminated = true;
                            return false;
                        }
                        // Update path state and previous path vertex after medium
                        // scattering
                        pdfFwd = ps->pdf;
                        beta *= ps->p / ps->pdf;
                        ray = intr.SpawnRay(ps->wi);
                        anyNonSpecularBounces = true;
                        prev.pdfRev = vertex.ConvertDensity(ps->pdf, prev);

                        scattered = true;
                        return false;

                    } else {
                        // Handle null scattering for _RandomWalk()_ ray
                        SampledSpectrum sigma_n =
                            ClampZero(sigma_maj - mp.sigma_a - mp.sigma_s);
                        Float pdf = T_maj[0] * sigma_n[0];
                        if (pdf == 0)
                            beta = SampledSpectrum(0.f);
                        else
                            beta *= T_maj * sigma_n / pdf;
                        return bool(beta);
                    }
                });
            // Update _beta_ for medium transmittance
            if (!scattered)
                beta *= T_maj / T_maj[0];
        }

        if (terminated)
            return bounces;
        if (scattered)
            continue;
        // Handle escaped rays after no medium scattering event
        if (!si) {
            // Capture escaped rays when tracing from the camera
            if (mode == TransportMode::Radiance) {
                vertex = Vertex::CreateLight(EndpointInteraction(ray), beta, pdfFwd);
                ++bounces;
            }

            break;
        }

        // Handle surface interaction for path generation
        SurfaceInteraction &isect = si->intr;
        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        ++totalBSDFs;
        // Initialize _vertex_ with surface intersection information
        vertex = Vertex::CreateSurface(isect, bsdf, beta, pdfFwd, prev);

        if (++bounces >= maxDepth)
            break;
        // Sample BSDF at current vertex
        Vector3f wo = isect.wo;
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D(), mode);
        if (!bs)
            break;
        pdfFwd = bs->pdfIsProportional ? bsdf.PDF(wo, bs->wi, mode) : bs->pdf;
        anyNonSpecularBounces |= !bs->IsSpecular();
        beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);

        // Compute path probabilities at surface vertex
        // TODO: confirm. I believe that !mode is right. Interestingly,
        // it makes no difference in the test suite either way.
        Float pdfRev = bsdf.PDF(bs->wi, wo, !mode);
        if (bs->IsSpecular()) {
            vertex.delta = true;
            pdfRev = pdfFwd = 0;
        }
        PBRT_DBG("%s\n",
                 StringPrintf("Random walk beta after shading normal correction %s", beta)
                     .c_str());
        prev.pdfRev = vertex.ConvertDensity(pdfRev, prev);
    }
    return bounces;
}